

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

void __thiscall
jbcoin::STAmount::STAmount
          (STAmount *this,SField *name,undefined8 *issue,mantissa_type mantissa,
          exponent_type exponent,bool native,bool negative)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
  uVar1 = issue[1];
  uVar2 = issue[2];
  uVar3 = issue[3];
  *(undefined8 *)(this->mIssue).currency.pn = *issue;
  *(undefined8 *)((this->mIssue).currency.pn + 2) = uVar1;
  *(undefined8 *)((this->mIssue).currency.pn + 4) = uVar2;
  *(undefined8 *)((this->mIssue).account.pn + 1) = uVar3;
  *(undefined8 *)((this->mIssue).account.pn + 3) = issue[4];
  this->mValue = mantissa;
  this->mOffset = exponent;
  this->mIsNative = native;
  this->mIsNegative = negative;
  return;
}

Assistant:

STAmount::STAmount (SField const& name, Issue const& issue,
        mantissa_type mantissa, exponent_type exponent,
            bool native, bool negative, unchecked)
    : STBase (name)
    , mIssue (issue)
    , mValue (mantissa)
    , mOffset (exponent)
    , mIsNative (native)
    , mIsNegative (negative)
{
}